

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

int __thiscall
FpgaIO::PromProgramPage(FpgaIO *this,uint32_t addr,uint8_t *bytes,uint nbytes,ProgressCallback cb)

{
  BasePort *pBVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  ostream *poVar5;
  char *pcVar6;
  string local_be0 [32];
  string local_bc0 [32];
  ostringstream local_ba0 [8];
  ostringstream msg_5;
  bool local_a25;
  uint local_a24;
  string local_a20 [3];
  bool ret;
  uint32_t status;
  string local_a00 [32];
  ostringstream local_9e0 [8];
  ostringstream msg_4;
  string local_868 [32];
  string local_848 [32];
  ostringstream local_828 [8];
  ostringstream msg_3;
  uint local_6ac;
  string local_6a8 [4];
  uint32_t nWritten;
  string local_688 [32];
  ostringstream local_668 [8];
  ostringstream msg_2;
  uint local_4ec;
  string local_4e8 [4];
  quadlet_t read_data;
  string local_4c8 [32];
  ostringstream local_4a8 [8];
  ostringstream msg_1;
  undefined8 local_330;
  nodeaddr_t address;
  uint32_t fver;
  quadlet_t *data_ptr;
  uint8_t page_data [260];
  string local_208 [32];
  string local_1e8 [48];
  ostringstream local_1b8 [8];
  ostringstream msg;
  uint MAX_PAGE;
  ProgressCallback cb_local;
  uint nbytes_local;
  uint8_t *bytes_local;
  uint32_t addr_local;
  FpgaIO *this_local;
  
  if (nbytes < 0x101) {
    PromWriteEnable(this,PROM_M25P16);
    data_ptr._0_4_ = __bswap_32(addr & 0xffffff | 0x2000000);
    memcpy((void *)((long)&data_ptr + 4),bytes,(ulong)nbytes);
    uVar3 = BoardIO::GetFirmwareVersion(&this->super_BoardIO);
    if (uVar3 < 4) {
      local_330 = 0xc0;
    }
    else {
      local_330 = 0x2000;
    }
    pBVar1 = (this->super_BoardIO).port;
    uVar4 = (*pBVar1->_vptr_BasePort[0x27])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,local_330,&data_ptr,
                       (ulong)(nbytes + 4));
    if ((uVar4 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_4a8);
      poVar5 = std::operator<<((ostream *)local_4a8,
                               "FpgaIO::PromProgramPage: failed to write block, nbytes = ");
      std::ostream::operator<<(poVar5,nbytes);
      if (cb == (ProgressCallback)0x0) {
        std::__cxx11::ostringstream::str();
        poVar5 = std::operator<<((ostream *)&std::cerr,local_4e8);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_4e8);
      }
      else {
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        (*cb)(pcVar6);
        std::__cxx11::string::~string(local_4c8);
      }
      std::__cxx11::ostringstream::~ostringstream(local_4a8);
    }
    else {
      pBVar1 = (this->super_BoardIO).port;
      uVar4 = (*pBVar1->_vptr_BasePort[0x23])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,8,&local_4ec);
      while ((uVar4 & 1) != 0) {
        if ((local_4ec & 0xf) == 0) {
          if ((local_4ec & 0xff000000) != 0) {
            std::__cxx11::ostringstream::ostringstream(local_668);
            poVar5 = std::operator<<((ostream *)local_668,"FpgaIO::PromProgramPage: FPGA error = ");
            std::ostream::operator<<(poVar5,local_4ec);
            if (cb == (ProgressCallback)0x0) {
              std::__cxx11::ostringstream::str();
              poVar5 = std::operator<<((ostream *)&std::cerr,local_6a8);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string(local_6a8);
            }
            else {
              std::__cxx11::ostringstream::str();
              pcVar6 = (char *)std::__cxx11::string::c_str();
              (*cb)(pcVar6);
              std::__cxx11::string::~string(local_688);
            }
            std::__cxx11::ostringstream::~ostringstream(local_668);
          }
          bVar2 = PromGetResult(this,&local_6ac,PROM_M25P16);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream(local_828);
            std::operator<<((ostream *)local_828,
                            "FpgaIO::PromProgramPage: could not get PROM result");
            if (cb == (ProgressCallback)0x0) {
              std::__cxx11::ostringstream::str();
              poVar5 = std::operator<<((ostream *)&std::cerr,local_868);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string(local_868);
            }
            else {
              std::__cxx11::ostringstream::str();
              pcVar6 = (char *)std::__cxx11::string::c_str();
              (*cb)(pcVar6);
              std::__cxx11::string::~string(local_848);
            }
            std::__cxx11::ostringstream::~ostringstream(local_828);
          }
          if (local_6ac != 0) {
            local_6ac = (local_6ac - 1) * 4;
          }
          if (local_6ac != nbytes) {
            std::__cxx11::ostringstream::ostringstream(local_9e0);
            poVar5 = std::operator<<((ostream *)local_9e0,"FpgaIO::PromProgramPage: wrote ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_6ac);
            poVar5 = std::operator<<(poVar5," of ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,nbytes);
            std::operator<<(poVar5," bytes");
            if (cb == (ProgressCallback)0x0) {
              std::__cxx11::ostringstream::str();
              poVar5 = std::operator<<((ostream *)&std::cerr,local_a20);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string(local_a20);
            }
            else {
              std::__cxx11::ostringstream::str();
              pcVar6 = (char *)std::__cxx11::string::c_str();
              (*cb)(pcVar6);
              std::__cxx11::string::~string(local_a00);
            }
            std::__cxx11::ostringstream::~ostringstream(local_9e0);
          }
          local_a25 = PromGetStatus(this,&local_a24,PROM_M25P16);
          do {
            if ((local_a24 & 1) == 0) {
              return local_6ac;
            }
            if (local_a25 == false) {
              std::__cxx11::ostringstream::ostringstream(local_ba0);
              poVar5 = std::operator<<((ostream *)local_ba0,
                                       "FpgaIO::PromProgramPage: could not get PROM status");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              if (cb == (ProgressCallback)0x0) {
                std::__cxx11::ostringstream::str();
                poVar5 = std::operator<<((ostream *)&std::cerr,local_be0);
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                std::__cxx11::string::~string(local_be0);
              }
              else {
                std::__cxx11::ostringstream::str();
                pcVar6 = (char *)std::__cxx11::string::c_str();
                (*cb)(pcVar6);
                std::__cxx11::string::~string(local_bc0);
              }
              std::__cxx11::ostringstream::~ostringstream(local_ba0);
            }
            else if (cb == (ProgressCallback)0x0) {
              std::operator<<((ostream *)&std::cout,'.');
            }
            else {
              bVar2 = (*cb)((char *)0x0);
              if (!bVar2) {
                return 0;
              }
            }
            local_a25 = PromGetStatus(this,&local_a24,PROM_M25P16);
          } while( true );
        }
        if (cb == (ProgressCallback)0x0) {
          std::operator<<((ostream *)&std::cout,'.');
        }
        else {
          bVar2 = (*cb)((char *)0x0);
          if (!bVar2) {
            return -1;
          }
        }
        pBVar1 = (this->super_BoardIO).port;
        uVar4 = (*pBVar1->_vptr_BasePort[0x23])
                          (pBVar1,(ulong)(this->super_BoardIO).BoardId,8,&local_4ec);
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar5 = std::operator<<((ostream *)local_1b8,"FpgaIO::PromProgramPage: error, nbytes = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,nbytes);
    poVar5 = std::operator<<(poVar5," (max = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x100);
    std::operator<<(poVar5,")");
    if (cb == (ProgressCallback)0x0) {
      std::__cxx11::ostringstream::str();
      poVar5 = std::operator<<((ostream *)&std::cerr,local_208);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_208);
    }
    else {
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      (*cb)(pcVar6);
      std::__cxx11::string::~string(local_1e8);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  return -1;
}

Assistant:

int FpgaIO::PromProgramPage(uint32_t addr, const uint8_t *bytes,
                           unsigned int nbytes, const ProgressCallback cb)
{
    const unsigned int MAX_PAGE = 256;  // 64 quadlets
    if (nbytes > MAX_PAGE) {
        std::ostringstream msg;
        msg << "FpgaIO::PromProgramPage: error, nbytes = " << nbytes
            << " (max = " << MAX_PAGE << ")";
        ERROR_CALLBACK(cb, msg);
        return -1;
    }
    PromWriteEnable();
    // Block write of the data (+1 quad for command)
    uint8_t page_data[MAX_PAGE+sizeof(quadlet_t)];
    quadlet_t *data_ptr = reinterpret_cast<quadlet_t *>(page_data);
    // First quadlet is the "page program" instruction (0x02)
    data_ptr[0] = bswap_32(0x02000000 | (addr & 0x00ffffff));
    // Remaining quadlets are the data to be programmed. These do not
    // need to be byte-swapped.
    memcpy(page_data+sizeof(quadlet_t), bytes, nbytes);

    // select address based on firmware version number
    uint32_t fver = GetFirmwareVersion();
    nodeaddr_t address;
    if (fver >= 4) {address = 0x2000;}
    else {address = 0xc0;}
    if (!port->WriteBlock(BoardId, address, data_ptr, nbytes+sizeof(quadlet_t))) {
        std::ostringstream msg;
        msg << "FpgaIO::PromProgramPage: failed to write block, nbytes = " << nbytes;
        ERROR_CALLBACK(cb, msg);
        return -1;
    }
    // Read FPGA status register; if 4 LSB are 0, command has finished
    quadlet_t read_data;
    if (!port->ReadQuadlet(BoardId, 0x08, read_data)) return -1;
    while (read_data&0x000f) {
        PROGRESS_CALLBACK(cb, -1);
        if (!port->ReadQuadlet(BoardId, 0x08, read_data)) return -1;
    }
    if (read_data & 0xff000000) { // shouldn't happen
        std::ostringstream msg;
        msg << "FpgaIO::PromProgramPage: FPGA error = " << read_data;
        ERROR_CALLBACK(cb, msg);
    }
    // Now, read result. This should be the number of quadlets written.
    uint32_t nWritten;
    if (!PromGetResult(nWritten)) {
        std::ostringstream msg;
        msg << "FpgaIO::PromProgramPage: could not get PROM result";
        ERROR_CALLBACK(cb, msg);
    }
    if (nWritten > 0)
        nWritten = 4*(nWritten-1);  // convert from quadlets to bytes
    if (nWritten != nbytes) {
        std::ostringstream msg;
        msg << "FpgaIO::PromProgramPage: wrote " << nWritten << " of "
            << nbytes << " bytes";
        ERROR_CALLBACK(cb, msg);
    }
    // Wait for "Write in Progress" bit to be cleared
    uint32_t status;
    bool ret = PromGetStatus(status);
    while (status&MASK_WIP) {
        if (ret) {
            PROGRESS_CALLBACK(cb, 0);
        }
        else {
            std::ostringstream msg;
            msg << "FpgaIO::PromProgramPage: could not get PROM status" << std::endl;
            ERROR_CALLBACK(cb, msg);
        }
        ret = PromGetStatus(status);
    }
    return nWritten;
}